

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

void matd_plu_destroy(matd_plu_t *mlu)

{
  free(mlu->lu);
  free(mlu->piv);
  free(mlu);
  return;
}

Assistant:

void matd_plu_destroy(matd_plu_t *mlu)
{
    matd_destroy(mlu->lu);
    free(mlu->piv);
    memset(mlu, 0, sizeof(matd_plu_t));
    free(mlu);
}